

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O2

int jpc_mqenc_flush(jpc_mqenc_t *mqenc,int termmode)

{
  long lVar1;
  long lVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  sbyte sVar8;
  uint uVar9;
  uint_fast32_t uVar10;
  long lVar11;
  uint_fast32_t uVar12;
  jas_stream_t *pjVar13;
  
  if (termmode == 0) {
    uVar6 = mqenc->creg | 0xffff;
    uVar7 = uVar6 - 0x8000;
    if (uVar6 < mqenc->areg + mqenc->creg) {
      uVar7 = uVar6;
    }
    uVar12 = uVar7 << ((byte)mqenc->ctreg & 0x3f);
    mqenc->creg = uVar12;
    lVar11 = mqenc->outbuf;
    if (lVar11 == 0xff) {
LAB_0012319e:
      pjVar13 = mqenc->out;
      if ((pjVar13->flags_ & 7U) == 0) {
        if ((-1 < pjVar13->rwlimit_) && (pjVar13->rwlimit_ <= pjVar13->rwcnt_)) {
          pjVar13->flags_ = pjVar13->flags_ | 4;
          goto LAB_001231ad;
        }
        *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
        iVar5 = pjVar13->cnt_;
        pjVar13->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
          iVar5 = jas_stream_flushbuf(pjVar13,0xff);
          if (iVar5 == -1) goto LAB_001231ad;
        }
        else {
          pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
          puVar3 = pjVar13->ptr_;
          pjVar13->ptr_ = puVar3 + 1;
          *puVar3 = 0xff;
        }
      }
      else {
LAB_001231ad:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
      uVar12 = 7;
      uVar9 = 0xfffff;
      sVar8 = 0x14;
    }
    else {
      uVar9 = (uint)uVar12;
      if ((uVar9 >> 0x1b & 1) == 0) {
        uVar12 = 8;
        uVar9 = 0x7ffff;
        sVar8 = 0x13;
        if (lVar11 < 0) goto LAB_001234da;
        pjVar13 = mqenc->out;
        if ((pjVar13->flags_ & 7U) == 0) {
          if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
            *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
            iVar5 = pjVar13->cnt_;
            pjVar13->cnt_ = iVar5 + -1;
            if (iVar5 < 1) {
              uVar4 = (uint)lVar11;
LAB_001234cc:
              sVar8 = 0x13;
              uVar12 = 8;
              uVar9 = 0x7ffff;
              iVar5 = jas_stream_flushbuf(pjVar13,uVar4 & 0xff);
              if (iVar5 == -1) goto LAB_001234d6;
            }
            else {
              pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
              puVar3 = pjVar13->ptr_;
              pjVar13->ptr_ = puVar3 + 1;
              *puVar3 = (uchar)lVar11;
            }
            goto LAB_001234da;
          }
          pjVar13->flags_ = pjVar13->flags_ | 4;
        }
        goto LAB_001234d6;
      }
      lVar2 = lVar11 + 1;
      mqenc->outbuf = lVar2;
      if (lVar2 == 0xff) {
        mqenc->creg = (ulong)(uVar9 & 0x7ffffff);
        goto LAB_0012319e;
      }
      uVar12 = 8;
      uVar9 = 0x7ffff;
      sVar8 = 0x13;
      if (-2 < lVar11) {
        pjVar13 = mqenc->out;
        if ((pjVar13->flags_ & 7U) == 0) {
          if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
            *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
            iVar5 = pjVar13->cnt_;
            pjVar13->cnt_ = iVar5 + -1;
            if (iVar5 < 1) {
              uVar4 = (uint)lVar2;
              goto LAB_001234cc;
            }
            pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
            puVar3 = pjVar13->ptr_;
            pjVar13->ptr_ = puVar3 + 1;
            *puVar3 = (uchar)lVar2;
            goto LAB_001234da;
          }
          pjVar13->flags_ = pjVar13->flags_ | 4;
        }
LAB_001234d6:
        sVar8 = 0x13;
        uVar12 = 8;
        uVar9 = 0x7ffff;
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
    }
LAB_001234da:
    mqenc->lastbyte = mqenc->outbuf;
    uVar7 = mqenc->creg >> sVar8;
    uVar6 = uVar7 & 0xff;
    uVar10 = (ulong)((uint)mqenc->creg & uVar9) << (sbyte)uVar12;
    mqenc->outbuf = uVar6;
    mqenc->ctreg = uVar12;
    mqenc->creg = uVar10;
    if (uVar6 == 0xff) {
LAB_00123512:
      pjVar13 = mqenc->out;
      if ((pjVar13->flags_ & 7U) == 0) {
        if ((-1 < pjVar13->rwlimit_) && (pjVar13->rwlimit_ <= pjVar13->rwcnt_)) {
          pjVar13->flags_ = pjVar13->flags_ | 4;
          goto LAB_00123521;
        }
        *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
        iVar5 = pjVar13->cnt_;
        pjVar13->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
          iVar5 = jas_stream_flushbuf(pjVar13,0xff);
          if (iVar5 == -1) goto LAB_00123521;
        }
        else {
          pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
          puVar3 = pjVar13->ptr_;
          pjVar13->ptr_ = puVar3 + 1;
          *puVar3 = 0xff;
        }
      }
      else {
LAB_00123521:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
      uVar12 = 7;
      uVar9 = 0xfffff;
      sVar8 = 0x14;
    }
    else {
      uVar9 = (uint)uVar10;
      if ((uVar9 >> 0x1b & 1) != 0) {
        uVar6 = uVar6 + 1;
        mqenc->outbuf = uVar6;
        if (uVar6 != 0xff) {
          pjVar13 = mqenc->out;
          if ((pjVar13->flags_ & 7U) == 0) {
            if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
              *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
              iVar5 = pjVar13->cnt_;
              pjVar13->cnt_ = iVar5 + -1;
              if (iVar5 < 1) goto LAB_00123642;
              pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
              puVar3 = pjVar13->ptr_;
              pjVar13->ptr_ = puVar3 + 1;
              *puVar3 = (uchar)uVar6;
              goto LAB_00123660;
            }
            pjVar13->flags_ = pjVar13->flags_ | 4;
          }
          goto LAB_0012365c;
        }
        mqenc->creg = (ulong)(uVar9 & 0x7fffffe);
        goto LAB_00123512;
      }
      pjVar13 = mqenc->out;
      if ((pjVar13->flags_ & 7U) == 0) {
        if ((-1 < pjVar13->rwlimit_) && (pjVar13->rwlimit_ <= pjVar13->rwcnt_)) {
          pjVar13->flags_ = pjVar13->flags_ | 4;
          goto LAB_0012365c;
        }
        *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
        iVar5 = pjVar13->cnt_;
        pjVar13->cnt_ = iVar5 + -1;
        if (iVar5 < 1) {
LAB_00123642:
          iVar5 = jas_stream_flushbuf(pjVar13,(int)uVar6);
          if (iVar5 == -1) goto LAB_0012365c;
        }
        else {
          pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
          puVar3 = pjVar13->ptr_;
          pjVar13->ptr_ = puVar3 + 1;
          *puVar3 = (uchar)uVar7;
        }
      }
      else {
LAB_0012365c:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
LAB_00123660:
      uVar12 = 8;
      uVar9 = 0x7ffff;
      sVar8 = 0x13;
    }
    mqenc->lastbyte = mqenc->outbuf;
    uVar6 = mqenc->creg >> sVar8;
    uVar7 = uVar6 & 0xff;
    mqenc->outbuf = uVar7;
    mqenc->creg = (ulong)((uint)mqenc->creg & uVar9);
    mqenc->ctreg = uVar12;
    if (uVar7 == 0xff) {
      return 0;
    }
    pjVar13 = mqenc->out;
    uVar9 = pjVar13->flags_;
    if ((uVar9 & 7) == 0) {
      if ((-1 < pjVar13->rwlimit_) && (pjVar13->rwlimit_ <= pjVar13->rwcnt_)) goto LAB_00123715;
      *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
      iVar5 = pjVar13->cnt_;
      pjVar13->cnt_ = iVar5 + -1;
      if (0 < iVar5) {
        pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
        puVar3 = pjVar13->ptr_;
        pjVar13->ptr_ = puVar3 + 1;
        *puVar3 = (uchar)uVar6;
        goto LAB_001236a8;
      }
LAB_0012371d:
      iVar5 = jas_stream_flushbuf(pjVar13,(int)uVar7);
      if (iVar5 != -1) goto LAB_001236a8;
    }
  }
  else {
    if (termmode != 1) {
      abort();
    }
    uVar12 = mqenc->ctreg;
    lVar11 = 0xc;
    while (lVar11 = lVar11 - uVar12, 0 < lVar11) {
      lVar2 = mqenc->outbuf;
      uVar12 = mqenc->creg << ((byte)uVar12 & 0x3f);
      mqenc->creg = uVar12;
      mqenc->ctreg = 0;
      if (lVar2 == 0xff) {
LAB_00122fae:
        pjVar13 = mqenc->out;
        uVar12 = 7;
        sVar8 = 0x14;
        if ((pjVar13->flags_ & 7U) == 0) {
          if ((-1 < pjVar13->rwlimit_) && (pjVar13->rwlimit_ <= pjVar13->rwcnt_)) {
            pjVar13->flags_ = pjVar13->flags_ | 4;
            goto LAB_00122fbd;
          }
          *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
          iVar5 = pjVar13->cnt_;
          pjVar13->cnt_ = iVar5 + -1;
          if (iVar5 < 1) {
            iVar5 = jas_stream_flushbuf(pjVar13,0xff);
            uVar9 = 0xfffff;
            if (iVar5 != -1) goto LAB_0012313f;
            goto LAB_00122fbd;
          }
          pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
          puVar3 = pjVar13->ptr_;
          pjVar13->ptr_ = puVar3 + 1;
          *puVar3 = 0xff;
        }
        else {
LAB_00122fbd:
          *(byte *)&mqenc->err = (byte)mqenc->err | 1;
        }
        uVar9 = 0xfffff;
      }
      else {
        uVar9 = (uint)uVar12;
        if ((uVar9 >> 0x1b & 1) == 0) {
          if (lVar2 < 0) goto LAB_00123139;
          pjVar13 = mqenc->out;
          if ((pjVar13->flags_ & 7U) == 0) {
            if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
              *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
              iVar5 = pjVar13->cnt_;
              pjVar13->cnt_ = iVar5 + -1;
              if (iVar5 < 1) {
                uVar9 = (uint)lVar2;
LAB_00123127:
                iVar5 = jas_stream_flushbuf(pjVar13,uVar9 & 0xff);
                if (iVar5 == -1) goto LAB_00123135;
              }
              else {
                pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
                puVar3 = pjVar13->ptr_;
                pjVar13->ptr_ = puVar3 + 1;
                *puVar3 = (uchar)lVar2;
              }
              goto LAB_00123139;
            }
            pjVar13->flags_ = pjVar13->flags_ | 4;
          }
          goto LAB_00123135;
        }
        lVar1 = lVar2 + 1;
        mqenc->outbuf = lVar1;
        if (lVar1 == 0xff) {
          mqenc->creg = (ulong)(uVar9 & 0x7ffffff);
          goto LAB_00122fae;
        }
        if (-2 < lVar2) {
          pjVar13 = mqenc->out;
          if ((pjVar13->flags_ & 7U) == 0) {
            if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
              *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
              iVar5 = pjVar13->cnt_;
              pjVar13->cnt_ = iVar5 + -1;
              if (iVar5 < 1) {
                uVar9 = (uint)lVar1;
                goto LAB_00123127;
              }
              pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
              puVar3 = pjVar13->ptr_;
              pjVar13->ptr_ = puVar3 + 1;
              *puVar3 = (uchar)lVar1;
              goto LAB_00123139;
            }
            pjVar13->flags_ = pjVar13->flags_ | 4;
          }
LAB_00123135:
          *(byte *)&mqenc->err = (byte)mqenc->err | 1;
        }
LAB_00123139:
        uVar12 = 8;
        uVar9 = 0x7ffff;
        sVar8 = 0x13;
      }
LAB_0012313f:
      mqenc->lastbyte = mqenc->outbuf;
      mqenc->outbuf = mqenc->creg >> sVar8 & 0xff;
      mqenc->creg = (ulong)((uint)mqenc->creg & uVar9);
      mqenc->ctreg = uVar12;
    }
    uVar7 = mqenc->outbuf;
    if (uVar7 == 0xff) {
      return 0;
    }
    uVar9 = (uint)mqenc->creg;
    if ((uVar9 >> 0x1b & 1) == 0) {
      if ((long)uVar7 < 0) goto LAB_001236a8;
      pjVar13 = mqenc->out;
      if ((pjVar13->flags_ & 7U) == 0) {
        if ((-1 < pjVar13->rwlimit_) && (pjVar13->rwlimit_ <= pjVar13->rwcnt_)) {
          pjVar13->flags_ = pjVar13->flags_ | 4;
          goto LAB_001236a4;
        }
        *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
        iVar5 = pjVar13->cnt_;
        pjVar13->cnt_ = iVar5 + -1;
        if (0 < iVar5) {
          pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
          puVar3 = pjVar13->ptr_;
          pjVar13->ptr_ = puVar3 + 1;
          *puVar3 = (uchar)uVar7;
          goto LAB_001236a8;
        }
        uVar7 = uVar7 & 0xff;
        goto LAB_0012371d;
      }
    }
    else {
      uVar6 = uVar7 + 1;
      mqenc->outbuf = uVar6;
      if (uVar6 == 0xff) {
        mqenc->creg = (ulong)(uVar9 & 0x7ffffff);
        pjVar13 = mqenc->out;
        if ((pjVar13->flags_ & 7U) == 0) {
          if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
            *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
            iVar5 = pjVar13->cnt_;
            pjVar13->cnt_ = iVar5 + -1;
            if (0 < iVar5) {
              pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
              puVar3 = pjVar13->ptr_;
              pjVar13->ptr_ = puVar3 + 1;
              *puVar3 = 0xff;
              goto LAB_001232f9;
            }
            iVar5 = jas_stream_flushbuf(pjVar13,0xff);
            if (iVar5 != -1) goto LAB_001232f9;
          }
          else {
            pjVar13->flags_ = pjVar13->flags_ | 4;
          }
        }
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
LAB_001232f9:
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = (ulong)((uint)mqenc->creg & 0xfffff);
        mqenc->ctreg = 7;
        return 0;
      }
      if ((long)uVar7 < -1) goto LAB_001236a8;
      pjVar13 = mqenc->out;
      uVar9 = pjVar13->flags_;
      if ((uVar9 & 7) != 0) goto LAB_001236a4;
      if ((pjVar13->rwlimit_ < 0) || (pjVar13->rwcnt_ < pjVar13->rwlimit_)) {
        *(byte *)&pjVar13->bufmode_ = (byte)pjVar13->bufmode_ | 0x20;
        iVar5 = pjVar13->cnt_;
        pjVar13->cnt_ = iVar5 + -1;
        if (0 < iVar5) {
          pjVar13->rwcnt_ = pjVar13->rwcnt_ + 1;
          puVar3 = pjVar13->ptr_;
          pjVar13->ptr_ = puVar3 + 1;
          *puVar3 = (uchar)uVar6;
          goto LAB_001236a8;
        }
        uVar7 = uVar6 & 0xff;
        goto LAB_0012371d;
      }
LAB_00123715:
      pjVar13->flags_ = uVar9 | 4;
    }
  }
LAB_001236a4:
  *(byte *)&mqenc->err = (byte)mqenc->err | 1;
LAB_001236a8:
  mqenc->lastbyte = mqenc->outbuf;
  mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
  mqenc->creg = (ulong)((uint)mqenc->creg & 0x7ffff);
  mqenc->ctreg = 8;
  return 0;
}

Assistant:

int jpc_mqenc_flush(jpc_mqenc_t *mqenc, int termmode)
{
	int_fast16_t k;

	switch (termmode) {
	case JPC_MQENC_PTERM:
		k = 11 - mqenc->ctreg + 1;
		while (k > 0) {
			mqenc->creg <<= mqenc->ctreg;
			mqenc->ctreg = 0;
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg,
			  mqenc);
			k -= mqenc->ctreg;
		}
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	case JPC_MQENC_DEFTERM:
		jpc_mqenc_setbits(mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	default:
		abort();
		break;
	}
	return 0;
}